

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite20_Test::TestBody
          (LiteBasicTest_AllLite20_Test *this)

{
  Map<int,_proto2_unittest::TestAllTypesLite> *this_00;
  int iVar1;
  TestAllTypesLite *pTVar2;
  int *piVar3;
  Nonnull<const_char_*> failure_msg;
  RepeatedField<int> *this_01;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TestMessageMapLite message2;
  TestMessageMapLite message1;
  AssertHelper local_b8;
  Message local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_98;
  key_arg<int> local_80 [2];
  TestMessageMapLite local_78;
  undefined1 local_40 [56];
  
  proto2_unittest::TestMessageMapLite::TestMessageMapLite
            ((TestMessageMapLite *)local_40,(Arena *)0x0);
  proto2_unittest::TestMessageMapLite::TestMessageMapLite(&local_78,(Arena *)0x0);
  this_00 = (Map<int,_proto2_unittest::TestAllTypesLite> *)(local_40 + 0x10);
  local_b0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  Map<int,proto2_unittest::TestAllTypesLite>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::TestAllTypesLite>::iterator,_bool> *)
             local_a0,this_00,(int *)&local_b0);
  RepeatedField<int>::Add((RepeatedField<int> *)(CONCAT71(local_a0._1_7_,local_a0[0]) + 0x30),100);
  local_b0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  Map<int,proto2_unittest::TestAllTypesLite>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::TestAllTypesLite>::iterator,_bool> *)
             local_a0,&local_78.field_0,(int *)&local_b0);
  RepeatedField<int>::Add((RepeatedField<int> *)(CONCAT71(local_a0._1_7_,local_a0[0]) + 0x30),0x65);
  proto2_unittest::TestMessageMapLite::CopyFrom((TestMessageMapLite *)local_40,&local_78);
  local_b0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  local_80[0] = 0;
  pTVar2 = Map<int,_proto2_unittest::TestAllTypesLite>::at<int>(this_00,local_80);
  local_b8.data_._0_4_ =
       internal::SooRep::size
                 (&(pTVar2->field_0)._impl_.repeated_int32_.soo_rep_,
                  (undefined1  [824])((undefined1  [824])pTVar2->field_0 & (undefined1  [824])0x4)
                  == (undefined1  [824])0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"1","message1.map_int32_message().at(0).repeated_int32_size()",
             (int *)&local_b0,(int *)&local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message(&local_b0);
    if (local_98._M_head_impl == (LogMessageData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)((local_98._M_head_impl)->entry).full_filename_._M_len;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x241,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((long *)CONCAT44(local_b0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_b0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_b0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_98._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_98._M_head_impl);
  }
  local_b8.data_._0_4_ = 0x65;
  local_80[1] = 0;
  pTVar2 = Map<int,_proto2_unittest::TestAllTypesLite>::at<int>(this_00,local_80 + 1);
  this_01 = &(pTVar2->field_0)._impl_.repeated_int32_;
  iVar1 = internal::SooRep::size
                    (&this_01->soo_rep_,
                     (undefined1  [824])
                     ((undefined1  [824])pTVar2->field_0 & (undefined1  [824])0x4) ==
                     (undefined1  [824])0x0);
  if (iVar1 < 1) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (0,(long)iVar1,"index < size()");
  }
  else {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    piVar3 = RepeatedField<int>::elements
                       (this_01,(undefined1  [16])
                                ((undefined1  [16])(this_01->soo_rep_).field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
    local_80[0] = *piVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_b0,"101","message1.map_int32_message().at(0).repeated_int32(0)",
               (int *)&local_b8,local_80);
    if (local_b0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x242,pcVar4);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if ((long *)CONCAT71(local_a0._1_7_,local_a0[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_a0._1_7_,local_a0[0]) + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    proto2_unittest::TestMessageMapLite::~TestMessageMapLite(&local_78);
    proto2_unittest::TestMessageMapLite::~TestMessageMapLite((TestMessageMapLite *)local_40);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x32c,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_a0);
}

Assistant:

TEST(LiteBasicTest, AllLite20) {
  {
    // CopyFromMessageMap
    proto2_unittest::TestMessageMapLite message1, message2;

    (*message1.mutable_map_int32_message())[0].add_repeated_int32(100);
    (*message2.mutable_map_int32_message())[0].add_repeated_int32(101);

    message1.CopyFrom(message2);  // NOLINT

    // Checks repeated field is overwritten.
    EXPECT_EQ(1, message1.map_int32_message().at(0).repeated_int32_size());
    EXPECT_EQ(101, message1.map_int32_message().at(0).repeated_int32(0));
  }
}